

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationDataBuilder::CollationDataBuilder(CollationDataBuilder *this,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int iVar2;
  UBool UVar3;
  Normalizer2Impl *pNVar4;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationDataBuilder_003f2368;
  pNVar4 = Normalizer2Factory::getNFCImpl(errorCode);
  this->nfcImpl = pNVar4;
  this->base = (CollationData *)0x0;
  this->baseSettings = (CollationSettings *)0x0;
  this->trie = (UTrie2 *)0x0;
  UVector32::UVector32(&this->ce32s,errorCode);
  UVector64::UVector64(&this->ce64s,errorCode);
  UVector::UVector(&this->conditionalCE32s,errorCode);
  UnicodeSet::UnicodeSet(&this->contextChars);
  (this->contexts).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->contexts).fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeSet::UnicodeSet(&this->unsafeBackwardSet);
  this->modified = '\0';
  this->fastLatinEnabled = '\0';
  this->fastLatinBuilder = (CollationFastLatinBuilder *)0x0;
  this->collIter = (DataBuilderCollationIterator *)0x0;
  iVar2 = (this->ce32s).count;
  if ((iVar2 < -1) || ((this->ce32s).capacity <= iVar2)) {
    UVar3 = UVector32::expandCapacity(&this->ce32s,iVar2 + 1,errorCode);
    if (UVar3 == '\0') goto LAB_00242eb3;
  }
  (this->ce32s).elements[(this->ce32s).count] = 0;
  piVar1 = &(this->ce32s).count;
  *piVar1 = *piVar1 + 1;
LAB_00242eb3:
  UVector::setDeleter(&this->conditionalCE32s,uprv_deleteConditionalCE32_63);
  return;
}

Assistant:

CollationDataBuilder::CollationDataBuilder(UErrorCode &errorCode)
        : nfcImpl(*Normalizer2Factory::getNFCImpl(errorCode)),
          base(NULL), baseSettings(NULL),
          trie(NULL),
          ce32s(errorCode), ce64s(errorCode), conditionalCE32s(errorCode),
          modified(FALSE),
          fastLatinEnabled(FALSE), fastLatinBuilder(NULL),
          collIter(NULL) {
    // Reserve the first CE32 for U+0000.
    ce32s.addElement(0, errorCode);
    conditionalCE32s.setDeleter(uprv_deleteConditionalCE32);
}